

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O2

void __thiscall
boost::exception_detail::error_info_injector<boost::condition_error>::error_info_injector
          (error_info_injector<boost::condition_error> *this,condition_error *x)

{
  condition_error::condition_error(&this->super_condition_error,x);
  (this->super_exception).throw_file_ = (char *)0x0;
  (this->super_exception).data_.px_ = (error_info_container *)0x0;
  (this->super_exception).throw_function_ = (char *)0x0;
  (this->super_exception).throw_line_ = -1;
  *(undefined ***)&(this->super_condition_error).super_system_error =
       &PTR__error_info_injector_001e3a90;
  (this->super_exception)._vptr_exception = (_func_int **)&PTR__error_info_injector_001e3ab8;
  return;
}

Assistant:

explicit
            error_info_injector( T const & x ):
                T(x)
                {
                }